

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void dense_rankValueFunc(sqlite3_context *pCtx)

{
  Mem *pMem;
  long *plVar1;
  
  if ((short)pCtx->pMem->flags < 0) {
    plVar1 = (long *)pCtx->pMem->z;
  }
  else {
    plVar1 = (long *)createAggContext(pCtx,0x18);
  }
  if (plVar1 != (long *)0x0) {
    if (plVar1[1] != 0) {
      *plVar1 = *plVar1 + 1;
      plVar1[1] = 0;
    }
    pMem = pCtx->pOut;
    if ((pMem->flags & 0x9000) != 0) {
      vdbeReleaseAndSetInt64(pMem,*plVar1);
      return;
    }
    (pMem->u).i = *plVar1;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void dense_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nStep ){
      p->nValue++;
      p->nStep = 0;
    }
    sqlite3_result_int64(pCtx, p->nValue);
  }
}